

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

char * helicsInputGetInjectionUnits(HelicsInput ipt)

{
  InputObject *pIVar1;
  string *units;
  InputObject *inpObj;
  Interface *in_stack_ffffffffffffffd0;
  HelicsInput in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  pIVar1 = anon_unknown.dwarf_5d1c2::verifyInput
                     (in_stack_ffffffffffffffd8,(HelicsError *)in_stack_ffffffffffffffd0);
  if (pIVar1 == (InputObject *)0x0) {
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffd0);
  }
  else {
    helics::Interface::getInjectionUnits_abi_cxx11_(in_stack_ffffffffffffffd0);
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffd0);
  }
  return local_8;
}

Assistant:

const char* helicsInputGetInjectionUnits(HelicsInput ipt)
{
    auto* inpObj = verifyInput(ipt, nullptr);
    if (inpObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& units = inpObj->inputPtr->getInjectionUnits();
        return units.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}